

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O0

DdNode * Cudd_addIteConstant(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  DdManager *data;
  DdManager *pDVar1;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint v;
  uint toph;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *Hnv;
  DdNode *Hv;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *zero;
  DdNode *one;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)g;
  if ((f != dd->one) && (dd_local = (DdManager *)h, f != dd->zero)) {
    one = h;
    h_local = g;
    g_local = f;
    f_local = &dd->sentinel;
    addVarToConst(f,&h_local,&one,dd->one,dd->zero);
    if (h_local == one) {
      dd_local = (DdManager *)h_local;
    }
    else if ((h_local->index == 0x7fffffff) && (one->index == 0x7fffffff)) {
      dd_local = (DdManager *)0x1;
    }
    else {
      if (g_local->index == 0x7fffffff) {
        local_9c = g_local->index;
      }
      else {
        local_9c = *(uint *)(f_local[7].Id + (ulong)g_local->index * 4);
      }
      if (h_local->index == 0x7fffffff) {
        local_a0 = h_local->index;
      }
      else {
        local_a0 = *(uint *)(f_local[7].Id + (ulong)h_local->index * 4);
      }
      if (one->index == 0x7fffffff) {
        local_a4 = one->index;
      }
      else {
        local_a4 = *(uint *)(f_local[7].Id + (ulong)one->index * 4);
      }
      if (local_a4 < local_a0) {
        local_a8 = local_a4;
      }
      else {
        local_a8 = local_a0;
      }
      local_98 = local_a8;
      if (((local_9c < local_a8) && (((g_local->type).kids.T)->index == 0x7fffffff)) &&
         (((g_local->type).kids.E)->index == 0x7fffffff)) {
        dd_local = (DdManager *)0x1;
      }
      else {
        dd_local = (DdManager *)cuddConstantLookup((DdManager *)f_local,0x62,g_local,h_local,one);
        if (dd_local == (DdManager *)0x0) {
          if (local_a8 < local_9c) {
            Gv = g_local;
            Fnv = g_local;
          }
          else {
            if (local_a8 < local_9c) {
              local_ac = local_a8;
            }
            else {
              local_ac = local_9c;
            }
            local_98 = local_ac;
            Fnv = (g_local->type).kids.T;
            Gv = (g_local->type).kids.E;
          }
          if (local_a0 == local_98) {
            Gnv = (h_local->type).kids.T;
            Hv = (h_local->type).kids.E;
          }
          else {
            Hv = h_local;
            Gnv = h_local;
          }
          if (local_a4 == local_98) {
            Hnv = (one->type).kids.T;
            r = (one->type).kids.E;
          }
          else {
            r = one;
            Hnv = one;
          }
          data = (DdManager *)Cudd_addIteConstant((DdManager *)f_local,Fnv,Gnv,Hnv);
          if ((data == (DdManager *)0x1) || ((data->sentinel).index != 0x7fffffff)) {
            cuddCacheInsert((DdManager *)f_local,0x62,g_local,h_local,one,(DdNode *)0x1);
            dd_local = (DdManager *)0x1;
          }
          else {
            pDVar1 = (DdManager *)Cudd_addIteConstant((DdManager *)f_local,Gv,Hv,r);
            if (((pDVar1 == (DdManager *)0x1) || ((pDVar1->sentinel).index != 0x7fffffff)) ||
               (data != pDVar1)) {
              cuddCacheInsert((DdManager *)f_local,0x62,g_local,h_local,one,(DdNode *)0x1);
              dd_local = (DdManager *)0x1;
            }
            else {
              cuddCacheInsert((DdManager *)f_local,0x62,g_local,h_local,one,(DdNode *)data);
              dd_local = data;
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addIteConstant(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *one,*zero;
    DdNode *Fv,*Fnv,*Gv,*Gnv,*Hv,*Hnv,*r,*t,*e;
    unsigned int topf,topg,toph,v;

    statLine(dd);
    /* Trivial cases. */
    if (f == (one = DD_ONE(dd))) {      /* ITE(1,G,H) = G */
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {    /* ITE(0,G,H) = H */
        return(h);
    }

    /* From now on, f is known not to be a constant. */
    addVarToConst(f,&g,&h,one,zero);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }
    if (cuddIsConstant(g) && cuddIsConstant(h)) {
        return(DD_NON_CONSTANT);
    }

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    toph = cuddI(dd,h->index);
    v = ddMin(topg,toph);

    /* ITE(F,G,H) = (x,G,H) (non constant) if F = (x,1,0), x < top(G,H). */
    if (topf < v && cuddIsConstant(cuddT(f)) && cuddIsConstant(cuddE(f))) {
        return(DD_NON_CONSTANT);
    }

    /* Check cache. */
    r = cuddConstantLookup(dd,DD_ADD_ITE_CONSTANT_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf,v);      /* v = top_var(F,G,H) */
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        Hv = cuddT(h); Hnv = cuddE(h);
    } else {
        Hv = Hnv = h;
    }
    
    /* Recursive step. */
    t = Cudd_addIteConstant(dd,Fv,Gv,Hv);
    if (t == DD_NON_CONSTANT || !cuddIsConstant(t)) {
        cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    e = Cudd_addIteConstant(dd,Fnv,Gnv,Hnv);
    if (e == DD_NON_CONSTANT || !cuddIsConstant(e) || t != e) {
        cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, DD_NON_CONSTANT);
        return(DD_NON_CONSTANT);
    }
    cuddCacheInsert(dd, DD_ADD_ITE_CONSTANT_TAG, f, g, h, t);
    return(t);

}